

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_strings.hpp
# Opt level: O0

Elf_Word __thiscall
ELFIO::string_section_accessor::add_string(string_section_accessor *this,char *str)

{
  section *psVar1;
  char *pcVar2;
  size_t sVar3;
  undefined1 local_1d;
  Elf_Word local_1c;
  char empty_string;
  char *pcStack_18;
  Elf_Word current_position;
  char *str_local;
  string_section_accessor *this_local;
  
  local_1c = 0;
  if (this->string_section != (section *)0x0) {
    pcStack_18 = str;
    str_local = (char *)this;
    local_1c = (*this->string_section->_vptr_section[0x13])();
    if (local_1c == 0) {
      local_1d = 0;
      (*this->string_section->_vptr_section[0x1a])(this->string_section,&local_1d,1);
      local_1c = local_1c + 1;
    }
    pcVar2 = pcStack_18;
    psVar1 = this->string_section;
    sVar3 = strlen(pcStack_18);
    (*psVar1->_vptr_section[0x1a])(psVar1,pcVar2,(ulong)((int)sVar3 + 1));
  }
  return local_1c;
}

Assistant:

Elf_Word
    add_string( const char* str )
    {
        Elf_Word current_position = 0;
        
        if (string_section) {
            // Strings are addeded to the end of the current section data
            current_position = (Elf_Word)string_section->get_size();

            if ( current_position == 0 ) {
                char empty_string = '\0';
                string_section->append_data( &empty_string, 1 );
                current_position++;
            }
            string_section->append_data( str, (Elf_Word)std::strlen( str ) + 1 );
        }

        return current_position;
    }